

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O1

void edition_unittest::TestVerifyUint32BigFieldNumber::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  MessageLite *from_msg_00;
  ulong uVar2;
  _func_int **pp_Var3;
  Nonnull<const_char_*> pcVar4;
  Arena *arena;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from_msg,to_msg,"&from != _this");
  }
  else {
    pcVar4 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar4 == (Nonnull<const_char_*>)0x0) {
    if (*(int *)&from_msg[2]._vptr_MessageLite != 0) {
      google::protobuf::internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
                ((RepeatedPtrFieldBase *)&to_msg[1]._internal_metadata_,
                 (RepeatedPtrFieldBase *)&from_msg[1]._internal_metadata_,
                 google::protobuf::Arena::CopyConstruct<edition_unittest::TestAllTypes>);
    }
    uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((uVar1 & 0x7f) != 0) {
      if ((uVar1 & 1) != 0) {
        from_msg_00 = (MessageLite *)from_msg[3]._vptr_MessageLite;
        if (from_msg_00 == (MessageLite *)0x0) {
          MergeImpl((TestVerifyUint32BigFieldNumber *)&stack0xffffffffffffffd0);
          goto LAB_00c6f323;
        }
        if ((MessageLite *)to_msg[3]._vptr_MessageLite == (MessageLite *)0x0) {
          pp_Var3 = (_func_int **)
                    google::protobuf::Arena::CopyConstruct<edition_unittest::TestAllTypes>
                              (arena,from_msg_00);
          to_msg[3]._vptr_MessageLite = pp_Var3;
        }
        else {
          TestAllTypes::MergeImpl((MessageLite *)to_msg[3]._vptr_MessageLite,from_msg_00);
        }
      }
      if ((uVar1 & 2) != 0) {
        *(int *)&to_msg[3]._internal_metadata_.ptr_ = (int)from_msg[3]._internal_metadata_.ptr_;
      }
      if ((uVar1 & 4) != 0) {
        *(undefined4 *)((long)&to_msg[3]._internal_metadata_.ptr_ + 4) =
             *(undefined4 *)((long)&from_msg[3]._internal_metadata_.ptr_ + 4);
      }
      if ((uVar1 & 8) != 0) {
        *(undefined4 *)&to_msg[4]._vptr_MessageLite = *(undefined4 *)&from_msg[4]._vptr_MessageLite;
      }
      if ((uVar1 & 0x10) != 0) {
        *(undefined4 *)((long)&to_msg[4]._vptr_MessageLite + 4) =
             *(undefined4 *)((long)&from_msg[4]._vptr_MessageLite + 4);
      }
      if ((uVar1 & 0x20) != 0) {
        *(int *)&to_msg[4]._internal_metadata_.ptr_ = (int)from_msg[4]._internal_metadata_.ptr_;
      }
      if ((uVar1 & 0x40) != 0) {
        *(undefined4 *)((long)&to_msg[4]._internal_metadata_.ptr_ + 4) =
             *(undefined4 *)((long)&from_msg[4]._internal_metadata_.ptr_ + 4);
      }
    }
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | uVar1;
    uVar2 = (from_msg->_internal_metadata_).ptr_;
    if ((uVar2 & 1) == 0) {
      return;
    }
    google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8));
    return;
  }
LAB_00c6f323:
  MergeImpl();
}

Assistant:

void TestVerifyUint32BigFieldNumber::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestVerifyUint32BigFieldNumber*>(&to_msg);
  auto& from = static_cast<const TestVerifyUint32BigFieldNumber&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestVerifyUint32BigFieldNumber)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_all_types()->MergeFrom(
      from._internal_repeated_all_types());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000007fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.optional_all_types_ != nullptr);
      if (_this->_impl_.optional_all_types_ == nullptr) {
        _this->_impl_.optional_all_types_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_all_types_);
      } else {
        _this->_impl_.optional_all_types_->MergeFrom(*from._impl_.optional_all_types_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.optional_uint32_1_ = from._impl_.optional_uint32_1_;
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.optional_uint32_2_ = from._impl_.optional_uint32_2_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.optional_uint32_63_ = from._impl_.optional_uint32_63_;
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.optional_uint32_64_ = from._impl_.optional_uint32_64_;
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.optional_uint32_1000_ = from._impl_.optional_uint32_1000_;
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      _this->_impl_.optional_uint32_65_ = from._impl_.optional_uint32_65_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}